

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O2

SystemMillisRange * QLocalTime::computeSystemMillisRange(void)

{
  long lVar1;
  time_t tVar2;
  bool bVar3;
  long lVar4;
  SystemMillisRange *in_RDI;
  bool bVar5;
  qint64 qVar6;
  long in_FS_OFFSET;
  tm local;
  int aiStack_60 [2];
  anon_struct_16_2_491a6482 ends [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ends[0].year = 0x116bd2d1;
  ends[0]._4_4_ = 0;
  ends[0].millis = 0x7fffffffffffffff;
  ends[1].year = 3000;
  ends[1]._4_4_ = 0;
  ends[1].millis = 0x1d9731fe0bff;
  lVar4 = 8;
  bVar5 = true;
  do {
    bVar3 = bVar5;
    if (lVar4 == 0x28) {
      qVar6 = 0x1f3ffffffff;
      break;
    }
    qVar6 = *(qint64 *)((long)&ends[0].year + lVar4);
    local.tm_gmtoff = 0;
    local.tm_zone = (char *)0x0;
    local.tm_wday = 0;
    local.tm_yday = 0;
    local.tm_year =
         (*(int *)((long)aiStack_60 + lVar4) - (*(int *)((long)aiStack_60 + lVar4) >> 0x1f)) +
         -0x76c;
    local.tm_mon = 0xb;
    local.tm_sec = 0x3b;
    local.tm_min = 0x3b;
    local.tm_hour = 0x17;
    local.tm_mday = 0x1f;
    local.tm_isdst = -1;
    local._36_4_ = 0;
    tVar2 = qMkTime(&local);
    lVar4 = lVar4 + 0x10;
    bVar5 = false;
  } while (tVar2 == -1);
  bVar5 = true;
  lVar4 = 8;
  do {
    if (lVar4 == 0x58) {
      in_RDI->min = 0;
      in_RDI->max = qVar6;
      in_RDI->minClip = false;
LAB_001217e7:
      in_RDI->maxClip = bVar3;
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    local.tm_wday = 0;
    local.tm_yday = 0;
    local.tm_sec = 0;
    local.tm_min = 0;
    local.tm_gmtoff = 0;
    local.tm_zone = (char *)0x0;
    local.tm_year =
         (*(int *)(&UNK_0016c6e8 + lVar4) - (*(int *)(&UNK_0016c6e8 + lVar4) >> 0x1f)) + -0x76c;
    local.tm_mon = 1;
    local.tm_hour = 0;
    local.tm_mday = 1;
    local.tm_isdst = -1;
    local._36_4_ = 0;
    tVar2 = qMkTime(&local);
    if (tVar2 != -1) {
      in_RDI->min = *(qint64 *)((long)&DAT_0016c6f0 + lVar4);
      in_RDI->max = qVar6;
      in_RDI->minClip = bVar5;
      goto LAB_001217e7;
    }
    lVar4 = lVar4 + 0x10;
    bVar5 = false;
  } while( true );
}

Assistant:

SystemMillisRange computeSystemMillisRange()
{
    // Assert this here, as this is called just once, in a static initialization.
    Q_ASSERT(QGregorianCalendar::julianFromParts(1970, 1, 1) == JULIAN_DAY_FOR_EPOCH);

    constexpr qint64 TIME_T_MAX = std::numeric_limits<time_t>::max();
    using Bounds = std::numeric_limits<qint64>;
    constexpr bool isNarrow = Bounds::max() / MSECS_PER_SEC > TIME_T_MAX;
    if constexpr (isNarrow) {
        const qint64 msecsMax = quint64(TIME_T_MAX) * MSECS_PER_SEC - 1 + MSECS_PER_SEC;
        const qint64 msecsMin = -1 - msecsMax; // TIME_T_MIN is -1 - TIME_T_MAX
        // If we reach back to msecsMin, use it; otherwise, assume 1970 cut-off (MS).
        struct tm local = {};
        local.tm_year = tmYearFromQYear(1901);
        local.tm_mon = 11;
        local.tm_mday = 15; // A day and a bit after the start of 32-bit time_t:
        local.tm_isdst = -1;
        return {qMkTime(&local) == -1 ? 0 : msecsMin, msecsMax, false, false};
    } else {
        const struct { int year; qint64 millis; } starts[] = {
            { int(QDateTime::YearRange::First) + 1, Bounds::min() },
            // Beginning of the Common Era:
            { 1, -Q_INT64_C(62135596800000) },
            // Invention of the Gregorian calendar:
            { 1582, -Q_INT64_C(12244089600000) },
            // Its adoption by the anglophone world:
            { 1752, -Q_INT64_C(6879427200000) },
            // Before this, struct tm's tm_year is negative (Darwin):
            { 1900, -Q_INT64_C(2208988800000) },
        }, ends[] = {
            { int(QDateTime::YearRange::Last) - 1, Bounds::max() },
            // MS's end-of-range, end of year 3000:
            { 3000, Q_INT64_C(32535215999999) },
        };
        // Assume we do at least reach the end of a signed 32-bit time_t (since
        // our actual time_t is bigger than that):
        qint64 stop =
            quint64(std::numeric_limits<qint32>::max()) * MSECS_PER_SEC - 1 + MSECS_PER_SEC;
        // Cleared if first pass round loop fails:
        bool stopMax = true;
        for (const auto c : ends) {
            struct tm local = {};
            local.tm_year = tmYearFromQYear(c.year);
            local.tm_mon = 11;
            local.tm_mday = 31;
            local.tm_hour = 23;
            local.tm_min = local.tm_sec = 59;
            local.tm_isdst = -1;
            if (qMkTime(&local) != -1) {
                stop = c.millis;
                break;
            }
            stopMax = false;
        }
        bool startMin = true;
        for (const auto c : starts) {
            struct tm local {};
            local.tm_year = tmYearFromQYear(c.year);
            local.tm_mon = 1;
            local.tm_mday = 1;
            local.tm_isdst = -1;
            if (qMkTime(&local) != -1)
                return {c.millis, stop, startMin, stopMax};
            startMin = false;
        }
        return {0, stop, false, stopMax};
    }
}